

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O3

size_t __thiscall adios2::aggregator::MPIShmChain::PreInit(MPIShmChain *this,Comm *parentComm)

{
  Comm *this_00;
  int iVar1;
  unsigned_long uVar2;
  Comm local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"creating per-node comm at Open","");
  helper::Comm::GroupByShm(&local_50,(string *)parentComm);
  this_00 = &this->m_NodeComm;
  helper::Comm::operator=(this_00,&local_50);
  helper::Comm::~Comm(&local_50);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  iVar1 = helper::Comm::Rank(this_00);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"creating chain of nodes at Open","");
  helper::Comm::Split(&local_50,(int)parentComm,(uint)(iVar1 != 0),(string *)0x0);
  helper::Comm::operator=(&this->m_OnePerNodeComm,&local_50);
  helper::Comm::~Comm(&local_50);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (iVar1 == 0) {
    iVar1 = helper::Comm::Size(&this->m_OnePerNodeComm);
    this->m_NumNodes = (long)iVar1;
  }
  uVar2 = helper::Comm::BroadcastValue<unsigned_long>(this_00,&this->m_NumNodes,0);
  this->m_NumNodes = uVar2;
  this->PreInitCalled = true;
  return uVar2;
}

Assistant:

size_t MPIShmChain::PreInit(helper::Comm const &parentComm)
{
    /* Communicator connecting ranks on each Compute Node */
    m_NodeComm = parentComm.GroupByShm("creating per-node comm at Open");
    int NodeRank = m_NodeComm.Rank();

    /*
     *  Communicators connecting rank N of each node
     *  We are only interested in the chain of rank 0s
     */
    int color = (NodeRank ? 1 : 0);
    m_OnePerNodeComm = parentComm.Split(color, 0, "creating chain of nodes at Open");

    /* Number of nodes */
    if (!NodeRank)
    {
        m_NumNodes = static_cast<size_t>(m_OnePerNodeComm.Size());
    }
    m_NumNodes = m_NodeComm.BroadcastValue<size_t>(m_NumNodes, 0);
    PreInitCalled = true;
    return m_NumNodes;
}